

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::InitializeLoop(cmCTestMultiProcessHandler *this)

{
  uv_loop_ptr *this_00;
  cmCTest *this_01;
  uv_loop_t *puVar1;
  ostream *poVar2;
  char *local_1f8 [4];
  _Any_data local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  ostringstream cmCTestLog_msg;
  
  this_00 = &this->Loop;
  ::cm::uv_loop_ptr::init(this_00,(EVP_PKEY_CTX *)0x0);
  puVar1 = ::cm::uv_loop_ptr::operator*(this_00);
  ::cm::uv_idle_ptr::init(&this->StartNextTestsOnIdle_,(EVP_PKEY_CTX *)puVar1);
  puVar1 = ::cm::uv_loop_ptr::operator*(this_00);
  ::cm::uv_timer_ptr::init(&this->StartNextTestsOnTimer_,(EVP_PKEY_CTX *)puVar1);
  puVar1 = ::cm::uv_loop_ptr::operator*(this_00);
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx:178:30)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx:178:30)>
              ::_M_manager;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b0._M_unused._M_object = this;
  cmUVJobServerClient::Connect
            ((cmUVJobServerClient *)&cmCTestLog_msg,puVar1,(function<void_()> *)&local_1b0,
             (function<void_(int)> *)&local_1d8);
  std::_Optional_payload_base<cmUVJobServerClient>::_M_move_assign
            ((_Optional_payload_base<cmUVJobServerClient> *)&this->JobServerClient,
             (_Optional_payload_base<cmUVJobServerClient> *)&cmCTestLog_msg);
  std::_Optional_payload_base<cmUVJobServerClient>::_M_reset
            ((_Optional_payload_base<cmUVJobServerClient> *)&cmCTestLog_msg);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b0);
  if ((this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
      super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
      super__Optional_payload_base<cmUVJobServerClient>._M_engaged == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Connected to MAKE jobserver");
    std::endl<char,std::char_traits<char>>(poVar2);
    this_01 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_01,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0xb6,local_1f8[0],false);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::InitializeLoop()
{
  this->Loop.init();
  this->StartNextTestsOnIdle_.init(*this->Loop, this);
  this->StartNextTestsOnTimer_.init(*this->Loop, this);

  this->JobServerClient = cmUVJobServerClient::Connect(
    *this->Loop, /*onToken=*/[this]() { this->JobServerReceivedToken(); },
    /*onDisconnect=*/nullptr);
  if (this->JobServerClient) {
    cmCTestLog(this->CTest, OUTPUT,
               "Connected to MAKE jobserver" << std::endl);
  }
}